

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O2

int check_matrix_entry(SUNMatrix A,sunrealtype val,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = 0;
  iVar6 = 0;
  while( true ) {
    lVar2 = SUNBandMatrix_Columns(A);
    if (lVar2 <= (long)uVar8) break;
    lVar2 = SUNBandMatrix_Column(A,uVar8);
    lVar3 = SUNBandMatrix_UpperBandwidth(A);
    uVar4 = uVar8;
    if (lVar3 <= (long)uVar8) {
      uVar4 = SUNBandMatrix_UpperBandwidth(A);
    }
    lVar3 = SUNBandMatrix_Columns(A);
    uVar5 = SUNBandMatrix_LowerBandwidth(A);
    if ((long)(~uVar5 + lVar3) < (long)uVar8) {
      lVar3 = SUNBandMatrix_Columns();
      lVar3 = ~uVar8 + lVar3;
    }
    else {
      lVar3 = SUNBandMatrix_LowerBandwidth(A);
    }
    for (lVar7 = -uVar4; lVar7 <= lVar3; lVar7 = lVar7 + 1) {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + lVar7 * 8),val,tol);
      if (iVar1 != 0) {
        iVar6 = iVar6 + 1;
        printf("j = %li, Acolj[%li] = %g, val = %g\n",*(undefined8 *)(lVar2 + lVar7 * 8),val,uVar8,
               lVar7);
      }
    }
    uVar8 = uVar8 + 1;
  }
  return (int)(0 < iVar6);
}

Assistant:

int check_matrix_entry(SUNMatrix A, sunrealtype val, sunrealtype tol)
{
  int failure = 0;
  sunindextype i, j, istart, iend;
  sunrealtype* Acolj;

  /* check matrix data */
  for (j = 0; j < SUNBandMatrix_Columns(A); j++)
  {
    /* access matrix column */
    Acolj = SUNBandMatrix_Column(A, j);

    /* compare entries in this column */
    istart = (j < SUNBandMatrix_UpperBandwidth(A))
               ? -j
               : -SUNBandMatrix_UpperBandwidth(A);
    iend = (j > SUNBandMatrix_Columns(A) - 1 - SUNBandMatrix_LowerBandwidth(A))
             ? SUNBandMatrix_Columns(A) - 1 - j
             : SUNBandMatrix_LowerBandwidth(A);
    for (i = istart; i <= iend; i++)
    {
      if (SUNRCompareTol(Acolj[i], val, tol))
      {
        failure++;
        printf("j = %li, Acolj[%li] = %" GSYM ", val = %" GSYM "\n",
               (long int)j, (long int)i, Acolj[i], val);
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}